

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O0

double __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
::local_compute_reduced_cost<baryonyx::bit_array>
          (solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
           *this,int variable,bit_array *x)

{
  __tuple_element_t<0UL,_tuple<col_value_*,_col_value_*>_> *ppcVar1;
  __tuple_element_t<1UL,_tuple<col_value_*,_col_value_*>_> *ppcVar2;
  type piVar3;
  type pdVar4;
  unique_ptr<int[],_std::default_delete<int[]>_> *this_00;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double a;
  type *hte;
  type *ht;
  _Head_base<0UL,_int_*,_false> local_28;
  double sum_a_pi_p;
  bit_array *x_local;
  solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
  *psStack_10;
  int variable_local;
  solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
  *this_local;
  
  local_28._M_head_impl = (int *)0x0;
  sum_a_pi_p = (double)x;
  x_local._4_4_ = variable;
  psStack_10 = this;
  sparse_matrix<int>::column((sparse_matrix<int> *)&ht,(int)this + 0x10);
  ppcVar1 = std::
            get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                      ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                        *)&ht);
  ppcVar2 = std::
            get<1ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                      ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                        *)&ht);
  while (*ppcVar1 != *ppcVar2) {
    this_00 = &this->A;
    piVar3 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       (this_00,(long)(*ppcVar1)->value);
    dVar5 = (double)*piVar3;
    std::abs((int)this_00);
    pdVar4 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->pi,(long)(*ppcVar1)->row);
    dVar6 = *pdVar4;
    pdVar4 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->P,(long)(*ppcVar1)->value);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar5;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_28._M_head_impl;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar6 + *pdVar4;
    auVar7 = vfmadd213sd_fma(auVar7,auVar8,auVar9);
    local_28._M_head_impl = auVar7._0_8_;
    *ppcVar1 = *ppcVar1 + 1;
  }
  dVar6 = quadratic_cost_type<double>::operator()(this->c,x_local._4_4_,(bit_array *)sum_a_pi_p);
  return dVar6 - (double)local_28._M_head_impl;
}

Assistant:

Float local_compute_reduced_cost(int variable, const Xtype& x) noexcept
    {
        Float sum_a_pi_p = 0;

        for (auto [ht, hte] = ap.column(variable); ht != hte; ++ht) {
            auto a = std::abs(static_cast<Float>(A[ht->value]));
            sum_a_pi_p += a * (pi[ht->row] + P[ht->value]);
        }

        return c(variable, x) - sum_a_pi_p;
    }